

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

bool phmap::priv::operator<
               (btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>_>
                *x,btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>_>
                   *y)

{
  bool bVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  const_iterator cVar5;
  undefined4 local_40;
  
  cVar2 = btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>::
          begin(&x->tree_);
  cVar3 = btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>::
          end(&x->tree_);
  cVar4 = btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>::
          begin(&y->tree_);
  cVar5 = btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>::
          end(&y->tree_);
  local_40 = cVar5.node._0_4_;
  bVar1 = std::
          __lexicographical_compare_impl<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>>const,int_const&,int_const*>,phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>>const,int_const&,int_const*>,__gnu_cxx::__ops::_Iter_less_iter>
                    (cVar2.node,cVar2.position,cVar3.node,cVar3.position,cVar4.node,cVar4.position,
                     local_40,cVar5.position);
  return bVar1;
}

Assistant:

bool operator<(const btree_container &x, const btree_container &y) {
            return std::lexicographical_compare(x.begin(), x.end(), y.begin(), y.end());
        }